

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::SimpleSystemTask::~SimpleSystemTask(SimpleSystemTask *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~SimpleSystemTask((SimpleSystemTask *)0x9c6888);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

SimpleSystemTask(KnownSystemName knownNameId, const Type& returnType, size_t requiredArgs = 0,
                     const std::vector<const Type*>& argTypes = {}) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Task, requiredArgs, argTypes,
                               returnType, false) {}